

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>::
Matches(OnCallSpec<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *this,
       ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<int>,testing::Matcher<BasicTestExpr<0>>>,std::tuple<int,BasicTestExpr<0>>>
                    ((tuple<testing::Matcher<int>,_testing::Matcher<BasicTestExpr<0>_>_> *)
                     (this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<int,_BasicTestExpr<0>_>_&>::Matches
                      ((MatcherBase<const_std::tuple<int,_BasicTestExpr<0>_>_&> *)(this + 0x40),args
                      );
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }